

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O1

deFunctionPtr __thiscall
tcu::StaticFunctionLibrary::getFunction(StaticFunctionLibrary *this,char *funcName)

{
  const_iterator cVar1;
  deFunctionPtr p_Var2;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,funcName,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>_>
          ::find(&(this->m_functions)._M_t,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_functions)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (deFunctionPtr)0x0;
  }
  else {
    p_Var2 = *(deFunctionPtr *)(cVar1._M_node + 2);
  }
  return p_Var2;
}

Assistant:

deFunctionPtr StaticFunctionLibrary::getFunction (const char* funcName) const
{
	std::map<std::string, deFunctionPtr>::const_iterator iter = m_functions.find(funcName);

	if (iter == m_functions.end())
		return DE_NULL;
	else
		return iter->second;
}